

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

SubTypeIterator<glu::IsBasicType> * __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator++(SubTypeIterator<glu::IsBasicType> *this)

{
  bool bVar1;
  SubTypeIterator<glu::IsBasicType> *this_local;
  
  bVar1 = std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::empty
                    (&this->m_path);
  if (bVar1) {
    this->m_type = (VarType *)0x0;
  }
  else {
    removeTraversed(this);
    bVar1 = std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::empty
                      (&this->m_path);
    if (bVar1) {
      this->m_type = (VarType *)0x0;
    }
    else {
      findNext(this);
    }
  }
  return this;
}

Assistant:

SubTypeIterator<IsExpanded>& SubTypeIterator<IsExpanded>::operator++ (void)
{
	if (!m_path.empty())
	{
		// Remove traversed nodes.
		removeTraversed();

		if (!m_path.empty())
			findNext();
		else
			m_type = DE_NULL; // Unset type to signal end.
	}
	else
	{
		// First type was already expanded.
		DE_ASSERT(IsExpanded()(getVarType(*m_type, m_path)));
		m_type = DE_NULL;
	}

	return *this;
}